

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NodeView.cc
# Opt level: O0

ostream * operator<<(ostream *os,NodeView *nv)

{
  ostream *poVar1;
  long *in_RSI;
  ostream *in_RDI;
  
  poVar1 = std::operator<<(in_RDI,"NodeView: Node ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*in_RSI);
  poVar1 = std::operator<<(poVar1," in ");
  std::operator<<(poVar1,(string *)(in_RSI[1] + 0x20));
  return in_RDI;
}

Assistant:

std::ostream &operator<<(std::ostream &os, const NodeView &nv) {
    os << "NodeView: Node "<<nv.id<<" in "<<nv.dg->name;
    return os;
}